

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O1

BoxList * __thiscall amrex::BoxList::accrete(BoxList *this,IntVect *sz)

{
  Box *pBVar1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  Box *bx;
  Box *this_00;
  
  pBVar1 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pBVar1; this_00 = this_00 + 1) {
    Box::grow(this_00,sz);
  }
  return this;
}

Assistant:

BoxList&
BoxList::accrete (const IntVect& sz)
{
    for (auto& bx : m_lbox)
    {
        bx.grow(sz);
    }
    return *this;
}